

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

void __thiscall Js::AsmJsModuleInfo::SetVarImportCount(AsmJsModuleInfo *this,int val)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_00;
  ModuleVarImport *ptr;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((this->mVarImports).ptr != (ModuleVarImport *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                ,0x68a,"(mVarImports == nullptr)","mVarImports == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->mVarImportCount = val;
  local_48 = (undefined1  [8])&ModuleVarImport::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_459a7a9;
  data.filename._0_4_ = 0x68c;
  data.plusSize = (long)val;
  this_00 = Memory::Recycler::TrackAllocInfo(this->mRecycler,(TrackAllocData *)local_48);
  ptr = Memory::AllocateArray<Memory::Recycler,Js::AsmJsModuleInfo::ModuleVarImport,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::Alloc,0,(long)val);
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleVarImport>::WriteBarrierSet
            (&this->mVarImports,ptr);
  return;
}

Assistant:

void AsmJsModuleInfo::SetVarImportCount(int val)
    {
        Assert(mVarImports == nullptr);
        mVarImportCount = val;
        mVarImports = RecyclerNewArray(mRecycler, ModuleVarImport, val);
    }